

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode Curl_rtsp_parseheader(connectdata *conn,char *header)

{
  char *__s2;
  int iVar1;
  ushort **ppuVar2;
  size_t __n;
  void *pvVar3;
  bool bVar4;
  byte *local_50;
  char *end;
  char *start;
  RTSP *rtsp;
  undefined8 uStack_30;
  int nc;
  long CSeq;
  SessionHandle *data;
  char *header_local;
  connectdata *conn_local;
  
  CSeq = (long)conn->data;
  uStack_30 = 0;
  data = (SessionHandle *)header;
  header_local = (char *)conn;
  iVar1 = Curl_raw_nequal("CSeq:",header,5);
  if (iVar1 == 0) {
    iVar1 = Curl_raw_nequal("Session:",(char *)data,8);
    if (iVar1 != 0) {
      end = (char *)&data->prev;
      while( true ) {
        bVar4 = false;
        if (*end != '\0') {
          ppuVar2 = __ctype_b_loc();
          bVar4 = ((*ppuVar2)[(int)(uint)(byte)*end] & 0x2000) != 0;
        }
        if (!bVar4) break;
        end = end + 1;
      }
      if (*end == '\0') {
        Curl_failf((SessionHandle *)CSeq,"Got a blank Session ID");
      }
      else if (*(long *)(CSeq + 0x5f0) == 0) {
        local_50 = (byte *)end;
        while( true ) {
          bVar4 = false;
          if (*local_50 != 0) {
            ppuVar2 = __ctype_b_loc();
            bVar4 = true;
            if (((((((*ppuVar2)[(int)(uint)*local_50] & 8) == 0) &&
                  (bVar4 = true, *local_50 != 0x2d)) && (bVar4 = true, *local_50 != 0x5f)) &&
                ((bVar4 = true, *local_50 != 0x2e && (bVar4 = true, *local_50 != 0x2b)))) &&
               ((bVar4 = false, *local_50 == 0x5c &&
                ((bVar4 = false, local_50[1] != 0 && (bVar4 = false, local_50[1] == 0x24)))))) {
              local_50 = local_50 + 1;
              bVar4 = true;
            }
          }
          if (!bVar4) break;
          local_50 = local_50 + 1;
        }
        pvVar3 = (*Curl_cmalloc)((size_t)(local_50 + (1 - (long)end)));
        *(void **)(CSeq + 0x5f0) = pvVar3;
        if (*(long *)(CSeq + 0x5f0) == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        memcpy(*(void **)(CSeq + 0x5f0),end,(long)local_50 - (long)end);
        local_50[*(long *)(CSeq + 0x5f0) - (long)end] = 0;
      }
      else {
        __s2 = *(char **)(CSeq + 0x5f0);
        __n = strlen(*(char **)(CSeq + 0x5f0));
        iVar1 = strncmp(end,__s2,__n);
        if (iVar1 != 0) {
          Curl_failf((SessionHandle *)CSeq,"Got RTSP Session ID Line [%s], but wanted ID [%s]",end,
                     *(undefined8 *)(CSeq + 0x5f0));
          return CURLE_RTSP_SESSION_ERROR;
        }
      }
    }
  }
  else {
    iVar1 = __isoc99_sscanf((undefined1 *)((long)&data->next + 4),": %ld",&stack0xffffffffffffffd0);
    if (iVar1 != 1) {
      Curl_failf((SessionHandle *)CSeq,"Unable to read the CSeq header: [%s]",data);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    *(undefined8 *)(*(long *)(CSeq + 0x1a8) + 0x90) = uStack_30;
    *(undefined8 *)(CSeq + 0x8a68) = uStack_30;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_rtsp_parseheader(struct connectdata *conn,
                               char *header)
{
  struct SessionHandle *data = conn->data;
  long CSeq = 0;

  if(checkprefix("CSeq:", header)) {
    /* Store the received CSeq. Match is verified in rtsp_done */
    int nc = sscanf(&header[4], ": %ld", &CSeq);
    if(nc == 1) {
      struct RTSP *rtsp = data->req.protop;
      rtsp->CSeq_recv = CSeq; /* mark the request */
      data->state.rtsp_CSeq_recv = CSeq; /* update the handle */
    }
    else {
      failf(data, "Unable to read the CSeq header: [%s]", header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
  }
  else if(checkprefix("Session:", header)) {
    char *start;

    /* Find the first non-space letter */
    start = header + 8;
    while(*start && ISSPACE(*start))
      start++;

    if(!*start) {
      failf(data, "Got a blank Session ID");
    }
    else if(data->set.str[STRING_RTSP_SESSION_ID]) {
      /* If the Session ID is set, then compare */
      if(strncmp(start, data->set.str[STRING_RTSP_SESSION_ID],
                 strlen(data->set.str[STRING_RTSP_SESSION_ID]))  != 0) {
        failf(data, "Got RTSP Session ID Line [%s], but wanted ID [%s]",
              start, data->set.str[STRING_RTSP_SESSION_ID]);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
    else {
      /* If the Session ID is not set, and we find it in a response, then
         set it */

      /* The session ID can be an alphanumeric or a 'safe' character
       *
       * RFC 2326 15.1 Base Syntax:
       * safe =  "\$" | "-" | "_" | "." | "+"
       * */
      char *end = start;
      while(*end &&
            (ISALNUM(*end) || *end == '-' || *end == '_' || *end == '.' ||
             *end == '+' ||
             (*end == '\\' && *(end + 1) && *(end + 1) == '$' && (++end, 1))))
        end++;

      /* Copy the id substring into a new buffer */
      data->set.str[STRING_RTSP_SESSION_ID] = malloc(end - start + 1);
      if(data->set.str[STRING_RTSP_SESSION_ID] == NULL)
        return CURLE_OUT_OF_MEMORY;
      memcpy(data->set.str[STRING_RTSP_SESSION_ID], start, end - start);
      (data->set.str[STRING_RTSP_SESSION_ID])[end - start] = '\0';
    }
  }
  return CURLE_OK;
}